

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_avx2.c
# Opt level: O2

void idct32_stage7_avx2(__m256i *bf1,__m256i *cospim32,__m256i *cospi32,__m256i *clamp_lo,
                       __m256i *clamp_hi,__m256i *rounding,int bit)

{
  undefined1 auVar1 [32];
  __m256i alVar2;
  __m256i alVar3;
  undefined1 auVar4 [32];
  
  auVar1 = vpaddd_avx2((undefined1  [32])bf1[7],(undefined1  [32])*bf1);
  auVar4 = vpsubd_avx2((undefined1  [32])*bf1,(undefined1  [32])bf1[7]);
  auVar1 = vpmaxsd_avx2(auVar1,(undefined1  [32])*clamp_lo);
  alVar2 = (__m256i)vpminsd_avx2(auVar1,(undefined1  [32])*clamp_hi);
  auVar1 = vpmaxsd_avx2(auVar4,(undefined1  [32])*clamp_lo);
  alVar3 = (__m256i)vpminsd_avx2(auVar1,(undefined1  [32])*clamp_hi);
  *bf1 = alVar2;
  bf1[7] = alVar3;
  auVar1 = vpaddd_avx2((undefined1  [32])bf1[6],(undefined1  [32])bf1[1]);
  auVar4 = vpsubd_avx2((undefined1  [32])bf1[1],(undefined1  [32])bf1[6]);
  auVar1 = vpmaxsd_avx2(auVar1,(undefined1  [32])*clamp_lo);
  alVar2 = (__m256i)vpminsd_avx2(auVar1,(undefined1  [32])*clamp_hi);
  auVar1 = vpmaxsd_avx2(auVar4,(undefined1  [32])*clamp_lo);
  alVar3 = (__m256i)vpminsd_avx2(auVar1,(undefined1  [32])*clamp_hi);
  bf1[1] = alVar2;
  bf1[6] = alVar3;
  auVar1 = vpaddd_avx2((undefined1  [32])bf1[5],(undefined1  [32])bf1[2]);
  auVar4 = vpsubd_avx2((undefined1  [32])bf1[2],(undefined1  [32])bf1[5]);
  auVar1 = vpmaxsd_avx2(auVar1,(undefined1  [32])*clamp_lo);
  alVar2 = (__m256i)vpminsd_avx2(auVar1,(undefined1  [32])*clamp_hi);
  auVar1 = vpmaxsd_avx2(auVar4,(undefined1  [32])*clamp_lo);
  alVar3 = (__m256i)vpminsd_avx2(auVar1,(undefined1  [32])*clamp_hi);
  bf1[2] = alVar2;
  bf1[5] = alVar3;
  auVar1 = vpaddd_avx2((undefined1  [32])bf1[4],(undefined1  [32])bf1[3]);
  auVar4 = vpsubd_avx2((undefined1  [32])bf1[3],(undefined1  [32])bf1[4]);
  auVar1 = vpmaxsd_avx2(auVar1,(undefined1  [32])*clamp_lo);
  alVar2 = (__m256i)vpminsd_avx2(auVar1,(undefined1  [32])*clamp_hi);
  auVar1 = vpmaxsd_avx2(auVar4,(undefined1  [32])*clamp_lo);
  alVar3 = (__m256i)vpminsd_avx2(auVar1,(undefined1  [32])*clamp_hi);
  bf1[3] = alVar2;
  bf1[4] = alVar3;
  auVar1 = vpmulld_avx2((undefined1  [32])bf1[10],(undefined1  [32])*cospim32);
  auVar4 = vpmulld_avx2((undefined1  [32])bf1[0xd],(undefined1  [32])*cospi32);
  auVar1 = vpaddd_avx2(auVar4,auVar1);
  auVar1 = vpaddd_avx2(auVar1,(undefined1  [32])*rounding);
  alVar2 = (__m256i)vpsrad_avx2(auVar1,ZEXT416((uint)bit));
  auVar1 = vpaddd_avx2((undefined1  [32])bf1[0xd],(undefined1  [32])bf1[10]);
  auVar1 = vpmulld_avx2(auVar1,(undefined1  [32])*cospi32);
  auVar1 = vpaddd_avx2(auVar1,(undefined1  [32])*rounding);
  alVar3 = (__m256i)vpsrad_avx2(auVar1,ZEXT416((uint)bit));
  bf1[0xd] = alVar3;
  bf1[10] = alVar2;
  auVar1 = vpmulld_avx2((undefined1  [32])bf1[0xb],(undefined1  [32])*cospim32);
  auVar4 = vpmulld_avx2((undefined1  [32])bf1[0xc],(undefined1  [32])*cospi32);
  auVar1 = vpaddd_avx2(auVar4,auVar1);
  auVar1 = vpaddd_avx2(auVar1,(undefined1  [32])*rounding);
  alVar2 = (__m256i)vpsrad_avx2(auVar1,ZEXT416((uint)bit));
  auVar1 = vpaddd_avx2((undefined1  [32])bf1[0xc],(undefined1  [32])bf1[0xb]);
  auVar1 = vpmulld_avx2(auVar1,(undefined1  [32])*cospi32);
  auVar1 = vpaddd_avx2(auVar1,(undefined1  [32])*rounding);
  alVar3 = (__m256i)vpsrad_avx2(auVar1,ZEXT416((uint)bit));
  bf1[0xc] = alVar3;
  bf1[0xb] = alVar2;
  auVar1 = vpaddd_avx2((undefined1  [32])bf1[0x17],(undefined1  [32])bf1[0x10]);
  auVar4 = vpsubd_avx2((undefined1  [32])bf1[0x10],(undefined1  [32])bf1[0x17]);
  auVar1 = vpmaxsd_avx2(auVar1,(undefined1  [32])*clamp_lo);
  alVar2 = (__m256i)vpminsd_avx2(auVar1,(undefined1  [32])*clamp_hi);
  auVar1 = vpmaxsd_avx2(auVar4,(undefined1  [32])*clamp_lo);
  alVar3 = (__m256i)vpminsd_avx2(auVar1,(undefined1  [32])*clamp_hi);
  bf1[0x10] = alVar2;
  bf1[0x17] = alVar3;
  auVar1 = vpaddd_avx2((undefined1  [32])bf1[0x16],(undefined1  [32])bf1[0x11]);
  auVar4 = vpsubd_avx2((undefined1  [32])bf1[0x11],(undefined1  [32])bf1[0x16]);
  auVar1 = vpmaxsd_avx2(auVar1,(undefined1  [32])*clamp_lo);
  alVar2 = (__m256i)vpminsd_avx2(auVar1,(undefined1  [32])*clamp_hi);
  auVar1 = vpmaxsd_avx2(auVar4,(undefined1  [32])*clamp_lo);
  alVar3 = (__m256i)vpminsd_avx2(auVar1,(undefined1  [32])*clamp_hi);
  bf1[0x11] = alVar2;
  bf1[0x16] = alVar3;
  auVar1 = vpaddd_avx2((undefined1  [32])bf1[0x15],(undefined1  [32])bf1[0x12]);
  auVar4 = vpsubd_avx2((undefined1  [32])bf1[0x12],(undefined1  [32])bf1[0x15]);
  auVar1 = vpmaxsd_avx2(auVar1,(undefined1  [32])*clamp_lo);
  alVar2 = (__m256i)vpminsd_avx2(auVar1,(undefined1  [32])*clamp_hi);
  auVar1 = vpmaxsd_avx2(auVar4,(undefined1  [32])*clamp_lo);
  alVar3 = (__m256i)vpminsd_avx2(auVar1,(undefined1  [32])*clamp_hi);
  bf1[0x12] = alVar2;
  bf1[0x15] = alVar3;
  auVar1 = vpaddd_avx2((undefined1  [32])bf1[0x14],(undefined1  [32])bf1[0x13]);
  auVar4 = vpsubd_avx2((undefined1  [32])bf1[0x13],(undefined1  [32])bf1[0x14]);
  auVar1 = vpmaxsd_avx2(auVar1,(undefined1  [32])*clamp_lo);
  alVar2 = (__m256i)vpminsd_avx2(auVar1,(undefined1  [32])*clamp_hi);
  auVar1 = vpmaxsd_avx2(auVar4,(undefined1  [32])*clamp_lo);
  alVar3 = (__m256i)vpminsd_avx2(auVar1,(undefined1  [32])*clamp_hi);
  bf1[0x13] = alVar2;
  bf1[0x14] = alVar3;
  auVar1 = vpaddd_avx2((undefined1  [32])bf1[0x18],(undefined1  [32])bf1[0x1f]);
  auVar4 = vpsubd_avx2((undefined1  [32])bf1[0x1f],(undefined1  [32])bf1[0x18]);
  auVar1 = vpmaxsd_avx2(auVar1,(undefined1  [32])*clamp_lo);
  alVar2 = (__m256i)vpminsd_avx2(auVar1,(undefined1  [32])*clamp_hi);
  auVar1 = vpmaxsd_avx2(auVar4,(undefined1  [32])*clamp_lo);
  alVar3 = (__m256i)vpminsd_avx2(auVar1,(undefined1  [32])*clamp_hi);
  bf1[0x1f] = alVar2;
  bf1[0x18] = alVar3;
  auVar1 = vpaddd_avx2((undefined1  [32])bf1[0x19],(undefined1  [32])bf1[0x1e]);
  auVar4 = vpsubd_avx2((undefined1  [32])bf1[0x1e],(undefined1  [32])bf1[0x19]);
  auVar1 = vpmaxsd_avx2(auVar1,(undefined1  [32])*clamp_lo);
  alVar2 = (__m256i)vpminsd_avx2(auVar1,(undefined1  [32])*clamp_hi);
  auVar1 = vpmaxsd_avx2(auVar4,(undefined1  [32])*clamp_lo);
  alVar3 = (__m256i)vpminsd_avx2(auVar1,(undefined1  [32])*clamp_hi);
  bf1[0x1e] = alVar2;
  bf1[0x19] = alVar3;
  auVar1 = vpaddd_avx2((undefined1  [32])bf1[0x1a],(undefined1  [32])bf1[0x1d]);
  auVar4 = vpsubd_avx2((undefined1  [32])bf1[0x1d],(undefined1  [32])bf1[0x1a]);
  auVar1 = vpmaxsd_avx2(auVar1,(undefined1  [32])*clamp_lo);
  alVar2 = (__m256i)vpminsd_avx2(auVar1,(undefined1  [32])*clamp_hi);
  auVar1 = vpmaxsd_avx2(auVar4,(undefined1  [32])*clamp_lo);
  alVar3 = (__m256i)vpminsd_avx2(auVar1,(undefined1  [32])*clamp_hi);
  bf1[0x1d] = alVar2;
  bf1[0x1a] = alVar3;
  auVar1 = vpaddd_avx2((undefined1  [32])bf1[0x1b],(undefined1  [32])bf1[0x1c]);
  auVar4 = vpsubd_avx2((undefined1  [32])bf1[0x1c],(undefined1  [32])bf1[0x1b]);
  auVar1 = vpmaxsd_avx2(auVar1,(undefined1  [32])*clamp_lo);
  alVar2 = (__m256i)vpminsd_avx2(auVar1,(undefined1  [32])*clamp_hi);
  auVar1 = vpmaxsd_avx2(auVar4,(undefined1  [32])*clamp_lo);
  alVar3 = (__m256i)vpminsd_avx2(auVar1,(undefined1  [32])*clamp_hi);
  bf1[0x1c] = alVar2;
  bf1[0x1b] = alVar3;
  return;
}

Assistant:

static inline void idct32_stage7_avx2(__m256i *x, const int32_t *cospi,
                                      const __m256i _r, int8_t cos_bit) {
  const __m256i cospi_m32_p32 = pair_set_w16_epi16(-cospi[32], cospi[32]);
  const __m256i cospi_p32_p32 = pair_set_w16_epi16(cospi[32], cospi[32]);
  btf_16_adds_subs_avx2(&x[0], &x[7]);
  btf_16_adds_subs_avx2(&x[1], &x[6]);
  btf_16_adds_subs_avx2(&x[2], &x[5]);
  btf_16_adds_subs_avx2(&x[3], &x[4]);
  btf_16_w16_avx2(cospi_m32_p32, cospi_p32_p32, &x[10], &x[13], _r, cos_bit);
  btf_16_w16_avx2(cospi_m32_p32, cospi_p32_p32, &x[11], &x[12], _r, cos_bit);
  btf_16_adds_subs_avx2(&x[16], &x[23]);
  btf_16_adds_subs_avx2(&x[17], &x[22]);
  btf_16_adds_subs_avx2(&x[18], &x[21]);
  btf_16_adds_subs_avx2(&x[19], &x[20]);
  btf_16_adds_subs_avx2(&x[31], &x[24]);
  btf_16_adds_subs_avx2(&x[30], &x[25]);
  btf_16_adds_subs_avx2(&x[29], &x[26]);
  btf_16_adds_subs_avx2(&x[28], &x[27]);
}